

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O2

double __thiscall CGL::Matrix3x3::det(Matrix3x3 *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar1 = this->entries[2].field_0.field_0.x;
  dVar2 = this->entries[1].field_0.field_0.y;
  dVar3 = this->entries[0].field_0.field_0.z;
  dVar4 = this->entries[1].field_0.field_0.x;
  dVar5 = this->entries[2].field_0.field_0.y;
  dVar6 = this->entries[0].field_0.field_0.x;
  dVar7 = this->entries[0].field_0.field_0.y;
  dVar8 = this->entries[1].field_0.field_0.z;
  dVar9 = this->entries[2].field_0.field_0.z;
  return dVar2 * dVar6 * dVar9 +
         (((dVar1 * dVar7 * dVar8 + (dVar3 * dVar4 * dVar5 - dVar2 * dVar1 * dVar3)) -
          dVar5 * dVar6 * dVar8) - dVar7 * dVar4 * dVar9);
}

Assistant:

double Matrix3x3::det( void ) const {
    const Matrix3x3& A( *this );

    return -A(0,2)*A(1,1)*A(2,0) + A(0,1)*A(1,2)*A(2,0) +
            A(0,2)*A(1,0)*A(2,1) - A(0,0)*A(1,2)*A(2,1) -
            A(0,1)*A(1,0)*A(2,2) + A(0,0)*A(1,1)*A(2,2) ;
  }